

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_NtkWindow2Solver
              (sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Int_t *vFlip,int PivotVar,int nDivs,int nTimes)

{
  sat_solver *s;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  sat_solver *s_00;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  sat_solver *local_60;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = CONCAT44(local_68._4_4_,**pCnf->pClauses);
  uVar6 = nTimes - 1;
  uVar1 = nTimes;
  if (nTimes < 3) {
    uVar1 = uVar6;
  }
  iVar2 = sat_solver_nvars(pSat);
  if (iVar2 != 0) {
    __assert_fail("sat_solver_nvars(pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x12f,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  uVar4 = 2;
  if (nTimes < 3) {
    uVar4 = uVar6;
  }
  local_60 = pSat;
  sat_solver_setnvars(pSat,uVar4 * nDivs + pCnf->nVars * nTimes + 2);
  if ((6 < (uint)nTimes) || ((0x46U >> (nTimes & 0x1fU) & 1) == 0)) {
    __assert_fail("nTimes == 1 || nTimes == 2 || nTimes == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x131,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  uVar4 = 0;
  do {
    if (uVar4 == nTimes) {
      if ((int)local_68 != **pCnf->pClauses) {
        __assert_fail("Test == pCnf->pClauses[0][0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                      ,0x140,
                      "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      iVar2 = 0;
      local_58 = 0;
      if (0 < nDivs) {
        local_58 = nDivs;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      s_00 = local_60;
      uVar6 = 0;
      local_48 = (ulong)(uint)nTimes;
      do {
        if (uVar6 == uVar1) {
          iVar2 = sat_solver_simplify(s_00);
          if (iVar2 == 0) {
            puts("Error: SAT solver became UNSAT at a wrong place.");
          }
          return 1;
        }
        iVar3 = pCnf->nVars;
        local_54 = uVar6 + 1;
        uVar8 = 0;
        local_40 = (ulong)(uint)((int)((ulong)local_54 % (local_48 & 0xffffffff)) * iVar3);
        iVar5 = 0;
        if ((uVar6 & 1) != 0) {
          iVar5 = nDivs;
        }
        uVar4 = iVar5 + iVar3 * (int)local_48;
        iVar9 = iVar3 * iVar2;
        uVar6 = iVar3 * uVar6;
        iVar5 = uVar4 * 2 + 1;
        iVar3 = local_58;
        local_50 = iVar2;
        while( true ) {
          s = local_60;
          if (iVar3 == 0) break;
          uVar7 = (int)local_40 + (int)uVar8;
          if ((int)(uVar7 | uVar6 | uVar4) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x17f,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          local_70 = uVar7 * 2 + 1;
          local_74 = iVar9;
          local_6c = iVar5;
          local_68 = (ulong)uVar4;
          local_4c = iVar3 + -1;
          local_38 = uVar8;
          iVar2 = sat_solver_addclause(local_60,&local_74,(lit *)&local_68);
          if (iVar2 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x185,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          local_70 = uVar7 * 2;
          local_74 = iVar9 + 1;
          local_6c = iVar5;
          iVar2 = sat_solver_addclause(s,&local_74,(lit *)&local_68);
          if (iVar2 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x18b,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          uVar8 = (ulong)((int)local_38 + 1);
          iVar9 = iVar9 + 2;
          uVar6 = uVar6 + 1;
          iVar5 = iVar5 + 2;
          uVar4 = (int)local_68 + 1;
          s_00 = s;
          iVar3 = local_4c;
        }
        iVar2 = local_50 + 2;
        uVar6 = local_54;
      } while( true );
    }
    if ((uVar4 & 1) != 0) {
      Cnf_DataLiftAndFlipLits(pCnf,-pCnf->nVars,vFlip);
    }
    for (lVar10 = 0; lVar10 < pCnf->nClauses; lVar10 = lVar10 + 1) {
      iVar2 = sat_solver_addclause(local_60,pCnf->pClauses[lVar10],pCnf->pClauses[lVar10 + 1]);
      if (iVar2 == 0) {
        puts("Error: SAT solver became UNSAT at a wrong place.");
      }
    }
    if ((uVar4 & 1) != 0) {
      Cnf_DataLiftAndFlipLits(pCnf,pCnf->nVars,vFlip);
    }
    if ((int)uVar4 < (int)uVar6) {
      iVar2 = pCnf->nVars;
LAB_0032e7b9:
      Cnf_DataLift(pCnf,iVar2);
    }
    else if (uVar4 != 0) {
      iVar2 = pCnf->nVars * (1 - nTimes);
      goto LAB_0032e7b9;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Acb_NtkWindow2Solver( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Int_t * vFlip, int PivotVar, int nDivs, int nTimes )
{
    int n, i, RetValue, Test = pCnf->pClauses[0][0];
    int nGroups = nTimes <= 2 ? nTimes-1 : 2;
    int nRounds = nTimes <= 2 ? nTimes-1 : nTimes;
    assert( sat_solver_nvars(pSat) == 0 );
    sat_solver_setnvars( pSat, nTimes * pCnf->nVars + nGroups * nDivs + 2 );
    assert( nTimes == 1 || nTimes == 2 || nTimes == 6 );
    for ( n = 0; n < nTimes; n++ )
    {
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, -pCnf->nVars, vFlip );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, pCnf->nVars, vFlip );
        if ( n < nTimes - 1 )
            Cnf_DataLift( pCnf, pCnf->nVars );
        else if ( n ) // if ( n == nTimes - 1 )
            Cnf_DataLift( pCnf, -(nTimes - 1) * pCnf->nVars );
    }
    assert( Test == pCnf->pClauses[0][0] );
    // add conditional buffers
    for ( n = 0; n < nRounds; n++ )
    {
        int BaseA = n * pCnf->nVars;
        int BaseB = ((n + 1) % nTimes) * pCnf->nVars;
        int BaseC = nTimes * pCnf->nVars + (n & 1) * nDivs;
        for ( i = 0; i < nDivs; i++ )
            sat_solver_add_buffer_enable( pSat, BaseA + i, BaseB + i, BaseC + i, 0 );
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( !RetValue ) printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
    return 1;
}